

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<const_char_*> * __thiscall
kj::_::NullableValue<const_char_*>::operator=
          (NullableValue<const_char_*> *this,NullableValue<const_char_*> *other)

{
  char **params;
  NullableValue<const_char_*> *other_local;
  NullableValue<const_char_*> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<char_const*>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<char_const*>(&(other->field_1).value);
      ctor<char_const*,char_const*>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }